

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::MergeMulNegateArithmetic::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *this_00;
  Instruction *context_00;
  Op OVar1;
  uint32_t id;
  TypeManager *this_01;
  const_reference ppCVar2;
  bool bVar3;
  Operand *local_180;
  allocator<spvtools::opt::Operand> local_165;
  uint32_t local_164;
  iterator local_160;
  undefined8 local_158;
  SmallVector<unsigned_int,_2UL> local_150;
  uint32_t local_124;
  iterator local_120;
  undefined8 local_118;
  SmallVector<unsigned_int,_2UL> local_110;
  Operand local_e8;
  Operand OStack_b8;
  iterator local_88;
  _func_int **local_80;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_78;
  uint32_t local_5c;
  Instruction *pIStack_58;
  uint32_t neg_id;
  Instruction *other_inst;
  Constant *const_input1;
  uint32_t width;
  bool uses_float;
  Type *type;
  ConstantManager *const_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  const_mgr = (ConstantManager *)constants;
  constants_local =
       (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        *)inst;
  inst_local = (Instruction *)context;
  context_local = (IRContext *)this;
  OVar1 = opt::Instruction::opcode(inst);
  bVar3 = true;
  if (OVar1 != OpFMul) {
    OVar1 = opt::Instruction::opcode((Instruction *)constants_local);
    bVar3 = OVar1 == OpIMul;
  }
  if (!bVar3) {
    __assert_fail("inst->opcode() == spv::Op::OpFMul || inst->opcode() == spv::Op::OpIMul",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x34f,
                  "auto spvtools::opt::(anonymous namespace)::MergeMulNegateArithmetic()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  type = (Type *)IRContext::get_constant_mgr((IRContext *)inst_local);
  this_01 = IRContext::get_type_mgr((IRContext *)inst_local);
  id = opt::Instruction::type_id((Instruction *)constants_local);
  _width = analysis::TypeManager::GetType(this_01,id);
  bVar3 = IsCooperativeMatrix(_width);
  if (bVar3) {
    this_local._7_1_ = false;
  }
  else {
    const_input1._7_1_ = HasFloatingPoint(_width);
    if (((bool)const_input1._7_1_) &&
       (bVar3 = opt::Instruction::IsFloatingPointFoldingAllowed((Instruction *)constants_local),
       !bVar3)) {
      return false;
    }
    const_input1._0_4_ = ElementWidth(_width);
    if (((uint32_t)const_input1 == 0x20) || ((uint32_t)const_input1 == 0x40)) {
      other_inst = (Instruction *)
                   ConstInput((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                               *)const_mgr);
      context_00 = inst_local;
      if (other_inst == (Instruction *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        ppCVar2 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::operator[]((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                *)const_mgr,0);
        pIStack_58 = NonConstInput((IRContext *)context_00,*ppCVar2,(Instruction *)constants_local);
        if (((const_input1._7_1_ & 1) != 0) &&
           (bVar3 = opt::Instruction::IsFloatingPointFoldingAllowed(pIStack_58), !bVar3)) {
          return false;
        }
        OVar1 = opt::Instruction::opcode(pIStack_58);
        if ((OVar1 != OpFNegate) &&
           (OVar1 = opt::Instruction::opcode(pIStack_58), OVar1 != OpSNegate)) {
          return false;
        }
        local_5c = NegateConstant((ConstantManager *)type,(Constant *)other_inst);
        this_00 = constants_local;
        local_124 = opt::Instruction::GetSingleWordInOperand(pIStack_58,0);
        local_120 = &local_124;
        local_118 = 1;
        init_list_00._M_len = 1;
        init_list_00._M_array = local_120;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_110,init_list_00);
        Operand::Operand(&local_e8,SPV_OPERAND_TYPE_ID,&local_110);
        local_164 = local_5c;
        local_160 = &local_164;
        local_158 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_160;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list);
        Operand::Operand(&OStack_b8,SPV_OPERAND_TYPE_ID,&local_150);
        local_88 = &local_e8;
        local_80 = (_func_int **)0x2;
        std::allocator<spvtools::opt::Operand>::allocator(&local_165);
        __l._M_len = (size_type)local_80;
        __l._M_array = local_88;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  (&local_78,__l,&local_165);
        opt::Instruction::SetInOperands((Instruction *)this_00,&local_78);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_78);
        std::allocator<spvtools::opt::Operand>::~allocator(&local_165);
        local_180 = (Operand *)&local_88;
        do {
          local_180 = local_180 + -1;
          Operand::~Operand(local_180);
        } while (local_180 != &local_e8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_110);
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

FoldingRule MergeMulNegateArithmetic() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>& constants) {
    assert(inst->opcode() == spv::Op::OpFMul ||
           inst->opcode() == spv::Op::OpIMul);
    analysis::ConstantManager* const_mgr = context->get_constant_mgr();
    const analysis::Type* type =
        context->get_type_mgr()->GetType(inst->type_id());

    if (IsCooperativeMatrix(type)) {
      return false;
    }

    bool uses_float = HasFloatingPoint(type);
    if (uses_float && !inst->IsFloatingPointFoldingAllowed()) return false;

    uint32_t width = ElementWidth(type);
    if (width != 32 && width != 64) return false;

    const analysis::Constant* const_input1 = ConstInput(constants);
    if (!const_input1) return false;
    Instruction* other_inst = NonConstInput(context, constants[0], inst);
    if (uses_float && !other_inst->IsFloatingPointFoldingAllowed())
      return false;

    if (other_inst->opcode() == spv::Op::OpFNegate ||
        other_inst->opcode() == spv::Op::OpSNegate) {
      uint32_t neg_id = NegateConstant(const_mgr, const_input1);

      inst->SetInOperands(
          {{SPV_OPERAND_TYPE_ID, {other_inst->GetSingleWordInOperand(0u)}},
           {SPV_OPERAND_TYPE_ID, {neg_id}}});
      return true;
    }

    return false;
  };
}